

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

bool __thiscall
google::protobuf::FieldDescriptorProto::MergePartialFromCodedStream
          (FieldDescriptorProto *this,CodedInputStream *input)

{
  CodedInputStream *pCVar1;
  bool bVar2;
  uint32 uVar3;
  int iVar4;
  WireType WVar5;
  string *psVar6;
  char *pcVar7;
  FieldOptions *value_00;
  UnknownFieldSet *pUVar8;
  FieldDescriptorProto_Type local_f4;
  FieldDescriptorProto_Label local_f0;
  int value_1;
  int value;
  uint32 tag;
  CodedInputStream *input_local;
  FieldDescriptorProto *this_local;
  CodedInputStream *local_d0;
  uint32 local_c8;
  undefined4 local_c4;
  CodedInputStream *local_c0;
  char local_b5;
  undefined4 local_b4;
  CodedInputStream *local_b0;
  char local_a5;
  undefined4 local_a4;
  CodedInputStream *local_a0;
  char local_95;
  undefined4 local_94;
  CodedInputStream *local_90;
  char local_85;
  undefined4 local_84;
  CodedInputStream *local_80;
  char local_75;
  undefined4 local_74;
  CodedInputStream *local_70;
  char local_65;
  undefined4 local_64;
  CodedInputStream *local_60;
  char local_55;
  uint32 local_54;
  int32 *piStack_50;
  uint32 temp;
  CodedInputStream *local_48;
  undefined1 local_3d;
  FieldDescriptorProto_Type local_3c;
  FieldDescriptorProto_Type *pFStack_38;
  uint32 temp_2;
  CodedInputStream *local_30;
  undefined1 local_25;
  FieldDescriptorProto_Label local_24;
  FieldDescriptorProto_Label *pFStack_20;
  uint32 temp_1;
  CodedInputStream *local_18;
  undefined1 local_9;
  
  _value = input;
  input_local = (CodedInputStream *)this;
LAB_002f6087:
  pCVar1 = _value;
  local_d0 = _value;
  if ((_value->buffer_ < _value->buffer_end_) && (*_value->buffer_ < 0x80)) {
    _value->last_tag_ = (uint)*_value->buffer_;
    io::CodedInputStream::Advance(_value,1);
    local_c8 = pCVar1->last_tag_;
  }
  else {
    uVar3 = io::CodedInputStream::ReadTagFallback(_value);
    pCVar1->last_tag_ = uVar3;
    local_c8 = pCVar1->last_tag_;
  }
  value_1 = local_c8;
  if (local_c8 == 0) {
    return true;
  }
  iVar4 = internal::WireFormatLite::GetTagFieldNumber(local_c8);
  switch(iVar4) {
  case 1:
    WVar5 = internal::WireFormatLite::GetTagWireType(value_1);
    pCVar1 = _value;
    if (WVar5 != WIRETYPE_LENGTH_DELIMITED) break;
    psVar6 = mutable_name_abi_cxx11_(this);
    bVar2 = internal::WireFormatLite::ReadString(pCVar1,psVar6);
    if (!bVar2) {
      return false;
    }
    name_abi_cxx11_(this);
    pcVar7 = (char *)std::__cxx11::string::data();
    name_abi_cxx11_(this);
    iVar4 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar7,iVar4,PARSE);
    local_60 = _value;
    local_64 = 0x12;
    if ((_value->buffer_ < _value->buffer_end_) && (*_value->buffer_ == '\x12')) {
      io::CodedInputStream::Advance(_value,1);
      local_55 = '\x01';
    }
    else {
      local_55 = '\0';
    }
    if (local_55 != '\0') {
LAB_002f62ff:
      pCVar1 = _value;
      psVar6 = mutable_extendee_abi_cxx11_(this);
      bVar2 = internal::WireFormatLite::ReadString(pCVar1,psVar6);
      if (!bVar2) {
        return false;
      }
      extendee_abi_cxx11_(this);
      pcVar7 = (char *)std::__cxx11::string::data();
      extendee_abi_cxx11_(this);
      iVar4 = std::__cxx11::string::length();
      internal::WireFormat::VerifyUTF8String(pcVar7,iVar4,PARSE);
      local_70 = _value;
      local_74 = 0x18;
      if ((_value->buffer_ < _value->buffer_end_) && (*_value->buffer_ == '\x18')) {
        io::CodedInputStream::Advance(_value,1);
        local_65 = '\x01';
      }
      else {
        local_65 = '\0';
      }
      if (local_65 != '\0') {
LAB_002f648c:
        piStack_50 = &this->number_;
        local_48 = _value;
        local_3d = io::CodedInputStream::ReadVarint32(_value,&local_54);
        if (!(bool)local_3d) {
          return false;
        }
        *piStack_50 = local_54;
        set_has_number(this);
        local_80 = _value;
        local_84 = 0x20;
        if ((_value->buffer_ < _value->buffer_end_) && (*_value->buffer_ == ' ')) {
          io::CodedInputStream::Advance(_value,1);
          local_75 = '\x01';
        }
        else {
          local_75 = '\0';
        }
        if (local_75 != '\0') {
LAB_002f6601:
          local_18 = _value;
          pFStack_20 = &local_f0;
          local_9 = io::CodedInputStream::ReadVarint32(_value,&local_24);
          if (!(bool)local_9) {
            return false;
          }
          *pFStack_20 = local_24;
          bVar2 = FieldDescriptorProto_Label_IsValid(local_f0);
          if (bVar2) {
            set_label(this,local_f0);
          }
          else {
            pUVar8 = mutable_unknown_fields(this);
            UnknownFieldSet::AddVarint(pUVar8,4,(long)(int)local_f0);
          }
          local_90 = _value;
          local_94 = 0x28;
          if ((_value->buffer_ < _value->buffer_end_) && (*_value->buffer_ == '(')) {
            io::CodedInputStream::Advance(_value,1);
            local_85 = '\x01';
          }
          else {
            local_85 = '\0';
          }
          if (local_85 != '\0') {
LAB_002f67c6:
            local_30 = _value;
            pFStack_38 = &local_f4;
            local_25 = io::CodedInputStream::ReadVarint32(_value,&local_3c);
            if (!(bool)local_25) {
              return false;
            }
            *pFStack_38 = local_3c;
            bVar2 = FieldDescriptorProto_Type_IsValid(local_f4);
            if (bVar2) {
              set_type(this,local_f4);
            }
            else {
              pUVar8 = mutable_unknown_fields(this);
              UnknownFieldSet::AddVarint(pUVar8,5,(long)(int)local_f4);
            }
            local_a0 = _value;
            local_a4 = 0x32;
            if ((_value->buffer_ < _value->buffer_end_) && (*_value->buffer_ == '2')) {
              io::CodedInputStream::Advance(_value,1);
              local_95 = '\x01';
            }
            else {
              local_95 = '\0';
            }
            if (local_95 != '\0') {
LAB_002f6999:
              pCVar1 = _value;
              psVar6 = mutable_type_name_abi_cxx11_(this);
              bVar2 = internal::WireFormatLite::ReadString(pCVar1,psVar6);
              if (!bVar2) {
                return false;
              }
              type_name_abi_cxx11_(this);
              pcVar7 = (char *)std::__cxx11::string::data();
              type_name_abi_cxx11_(this);
              iVar4 = std::__cxx11::string::length();
              internal::WireFormat::VerifyUTF8String(pcVar7,iVar4,PARSE);
              local_b0 = _value;
              local_b4 = 0x3a;
              if ((_value->buffer_ < _value->buffer_end_) && (*_value->buffer_ == ':')) {
                io::CodedInputStream::Advance(_value,1);
                local_a5 = '\x01';
              }
              else {
                local_a5 = '\0';
              }
              if (local_a5 != '\0') {
LAB_002f6b53:
                pCVar1 = _value;
                psVar6 = mutable_default_value_abi_cxx11_(this);
                bVar2 = internal::WireFormatLite::ReadString(pCVar1,psVar6);
                if (!bVar2) {
                  return false;
                }
                default_value_abi_cxx11_(this);
                pcVar7 = (char *)std::__cxx11::string::data();
                default_value_abi_cxx11_(this);
                iVar4 = std::__cxx11::string::length();
                internal::WireFormat::VerifyUTF8String(pcVar7,iVar4,PARSE);
                local_c0 = _value;
                local_c4 = 0x42;
                if ((_value->buffer_ < _value->buffer_end_) && (*_value->buffer_ == 'B')) {
                  io::CodedInputStream::Advance(_value,1);
                  local_b5 = '\x01';
                }
                else {
                  local_b5 = '\0';
                }
                if (local_b5 != '\0') {
LAB_002f6d0d:
                  pCVar1 = _value;
                  value_00 = mutable_options(this);
                  bVar2 = internal::WireFormatLite::
                          ReadMessageNoVirtual<google::protobuf::FieldOptions>(pCVar1,value_00);
                  if (!bVar2) {
                    return false;
                  }
                  bVar2 = io::CodedInputStream::ExpectAtEnd(_value);
                  if (bVar2) {
                    return true;
                  }
                }
              }
            }
          }
        }
      }
    }
    goto LAB_002f6087;
  case 2:
    WVar5 = internal::WireFormatLite::GetTagWireType(value_1);
    if (WVar5 == WIRETYPE_LENGTH_DELIMITED) goto LAB_002f62ff;
    break;
  case 3:
    WVar5 = internal::WireFormatLite::GetTagWireType(value_1);
    if (WVar5 == WIRETYPE_VARINT) goto LAB_002f648c;
    break;
  case 4:
    WVar5 = internal::WireFormatLite::GetTagWireType(value_1);
    if (WVar5 == WIRETYPE_VARINT) goto LAB_002f6601;
    break;
  case 5:
    WVar5 = internal::WireFormatLite::GetTagWireType(value_1);
    if (WVar5 == WIRETYPE_VARINT) goto LAB_002f67c6;
    break;
  case 6:
    WVar5 = internal::WireFormatLite::GetTagWireType(value_1);
    if (WVar5 == WIRETYPE_LENGTH_DELIMITED) goto LAB_002f6999;
    break;
  case 7:
    WVar5 = internal::WireFormatLite::GetTagWireType(value_1);
    if (WVar5 == WIRETYPE_LENGTH_DELIMITED) goto LAB_002f6b53;
    break;
  case 8:
    WVar5 = internal::WireFormatLite::GetTagWireType(value_1);
    if (WVar5 == WIRETYPE_LENGTH_DELIMITED) goto LAB_002f6d0d;
  }
  WVar5 = internal::WireFormatLite::GetTagWireType(value_1);
  pCVar1 = _value;
  iVar4 = value_1;
  if (WVar5 == WIRETYPE_END_GROUP) {
    return true;
  }
  pUVar8 = mutable_unknown_fields(this);
  bVar2 = internal::WireFormat::SkipField(pCVar1,iVar4,pUVar8);
  if (!bVar2) {
    return false;
  }
  goto LAB_002f6087;
}

Assistant:

bool FieldDescriptorProto::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(18)) goto parse_extendee;
        break;
      }

      // optional string extendee = 2;
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_extendee:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_extendee()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->extendee().data(), this->extendee().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(24)) goto parse_number;
        break;
      }

      // optional int32 number = 3;
      case 3: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_number:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &number_)));
          set_has_number();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(32)) goto parse_label;
        break;
      }

      // optional .google.protobuf.FieldDescriptorProto.Label label = 4;
      case 4: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_label:
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::google::protobuf::FieldDescriptorProto_Label_IsValid(value)) {
            set_label(static_cast< ::google::protobuf::FieldDescriptorProto_Label >(value));
          } else {
            mutable_unknown_fields()->AddVarint(4, value);
          }
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(40)) goto parse_type;
        break;
      }

      // optional .google.protobuf.FieldDescriptorProto.Type type = 5;
      case 5: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_type:
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::google::protobuf::FieldDescriptorProto_Type_IsValid(value)) {
            set_type(static_cast< ::google::protobuf::FieldDescriptorProto_Type >(value));
          } else {
            mutable_unknown_fields()->AddVarint(5, value);
          }
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(50)) goto parse_type_name;
        break;
      }

      // optional string type_name = 6;
      case 6: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_type_name:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_type_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->type_name().data(), this->type_name().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(58)) goto parse_default_value;
        break;
      }

      // optional string default_value = 7;
      case 7: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_default_value:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_default_value()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->default_value().data(), this->default_value().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(66)) goto parse_options;
        break;
      }

      // optional .google.protobuf.FieldOptions options = 8;
      case 8: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_options:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_options()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}